

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O2

bool ON_SubDEdgeSharpness::IsConstant(size_t edge_count,ON_SubDEdgePtr *edges,bool bCreaseResult)

{
  ON_SubDEdgeSharpness OVar1;
  ON_SubDEdgeSharpness OVar2;
  bool bVar3;
  ulong uVar4;
  long lVar5;
  float local_38;
  ON_SubDEdgeSharpness local_28;
  
  if (edges != (ON_SubDEdgePtr *)0x0 && edge_count != 0) {
    OVar1 = ON_SubDEdgePtr::RelativeSharpness(edges,true);
    local_28 = OVar1;
    bVar3 = IsConstant(&local_28,bCreaseResult);
    if (bVar3) {
      uVar4 = edges->m_ptr & 0xfffffffffffffff8;
      if ((uVar4 != 0) && (*(long *)(uVar4 + 0x80 + (ulong)((uint)edges->m_ptr & 1) * 8) != 0)) {
        lVar5 = edge_count + 1;
        do {
          lVar5 = lVar5 + -1;
          bVar3 = lVar5 == 0;
          if (bVar3) {
            return bVar3;
          }
          OVar2 = ON_SubDEdgePtr::RelativeSharpness(edges,true);
          local_38 = OVar1.m_edge_sharpness[0];
          if (local_38 != OVar2.m_edge_sharpness[0]) {
            return bVar3;
          }
          edges = edges + 1;
          if (local_38 != OVar2.m_edge_sharpness[1]) {
            return bVar3;
          }
        } while (!NAN(local_38) && !NAN(OVar2.m_edge_sharpness[1]));
        return bVar3;
      }
    }
  }
  return false;
}

Assistant:

bool ON_SubDEdgeSharpness::IsConstant(
  size_t edge_count,
  const ON_SubDEdgePtr* edges,
  bool bCreaseResult
)
{
  if (edge_count < 1 || nullptr == edges)
    return false;
  
  ON_SubDEdgeSharpness s = edges[0].RelativeSharpness(true);
  if (false == s.IsConstant(bCreaseResult))
    return false;
  const double c = s[0];
  if (nullptr == edges[0].RelativeVertex(0))
    return false; // not an edge chain
  for (size_t i = 0; i < edge_count; ++i)
  {
    s = edges[i].RelativeSharpness(true);
    if ( false == (c == s.EndSharpness(0) && c == s.EndSharpness(1)))
      return false;
  }

  return true;
}